

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool NeedReparseTagDecls(TidyDocImpl *doc,TidyOptionValue *current,TidyOptionValue *new,
                        uint *changedUserTags)

{
  TidyOptionId TVar1;
  uint uVar2;
  Bool BVar3;
  Bool BVar4;
  TidyOptionImpl *option;
  ulong uVar5;
  
  *(undefined4 *)new = 0;
  option = option_defs;
  uVar5 = 0;
  BVar4 = no;
  do {
    if (uVar5 == 0x68) {
      return BVar4;
    }
    TVar1 = option->id;
    if (uVar5 != TVar1) {
      __assert_fail("ixVal == (uint) option->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x243,
                    "Bool NeedReparseTagDecls(TidyDocImpl *, const TidyOptionValue *, const TidyOptionValue *, uint *)"
                   );
    }
    if (TVar1 == TidyBlockTags) {
      BVar3 = OptionValueIdentical(option,(TidyOptionValue *)doc,current);
      uVar2 = 4;
LAB_00133965:
      if (BVar3 == no) {
        *(uint *)new = *(uint *)new | uVar2;
        BVar4 = yes;
      }
    }
    else {
      if (TVar1 == TidyEmptyTags) {
        BVar3 = OptionValueIdentical(option,(TidyOptionValue *)doc,current);
        uVar2 = 1;
        goto LAB_00133965;
      }
      if (TVar1 == TidyPreTags) {
        BVar3 = OptionValueIdentical(option,(TidyOptionValue *)doc,current);
        uVar2 = 8;
        goto LAB_00133965;
      }
      if (TVar1 == TidyInlineTags) {
        BVar3 = OptionValueIdentical(option,(TidyOptionValue *)doc,current);
        uVar2 = 2;
        goto LAB_00133965;
      }
    }
    option = option + 1;
    uVar5 = uVar5 + 1;
    doc = (TidyDocImpl *)((long)doc + 8);
    current = current + 1;
  } while( true );
}

Assistant:

static Bool NeedReparseTagDecls( TidyDocImpl* doc,
                                 const TidyOptionValue* current,
                                 const TidyOptionValue* new,
                                 uint *changedUserTags )
{
    Bool ret = no;
    uint ixVal;
    const TidyOptionImpl* option = option_defs;
    *changedUserTags = tagtype_null;

    for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
    {
        assert( ixVal == (uint) option->id );
        switch (option->id)
        {
#define TEST_USERTAGS(USERTAGOPTION,USERTAGTYPE) \
        case USERTAGOPTION: \
            if (!OptionValueIdentical(option,&current[ixVal],&new[ixVal])) \
            { \
                *changedUserTags |= USERTAGTYPE; \
                ret = yes; \
            } \
            break
            TEST_USERTAGS(TidyInlineTags,tagtype_inline);
            TEST_USERTAGS(TidyBlockTags,tagtype_block);
            TEST_USERTAGS(TidyEmptyTags,tagtype_empty);
            TEST_USERTAGS(TidyPreTags,tagtype_pre);
        default:
            break;
        }
    }
    return ret;
}